

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O0

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::line
          (ImGuiDrawListGraphicsAdaptor *this,float ax,float ay,float bx,float by,color *c,
          float thickness)

{
  undefined8 *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  ImVec2 *unaff_retaddr;
  ImVec2 *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  undefined8 uVar1;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  ImColor *in_stack_ffffffffffffffc0;
  ImVec2 local_34;
  ImVec2 local_2c [2];
  float local_18;
  float local_14;
  
  uVar1 = *in_RDI;
  local_18 = in_XMM3_Da;
  local_14 = in_XMM2_Da;
  ImVec2::ImVec2(local_2c,in_XMM0_Da,in_XMM1_Da);
  ImVec2::ImVec2(&local_34,local_14,local_18);
  ImColor::ImColor(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                   (float)((ulong)uVar1 >> 0x20),(float)uVar1);
  ImColor::operator_cast_to_unsigned_int((ImColor *)0x196b6d);
  ImDrawList::AddLine(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (ImU32)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::line(float ax, float ay, float bx, float by,
                                        const color::color& c,
                                        float thickness) {
    draw_list->AddLine(ImVec2(ax, ay), ImVec2(bx, by),
                       ImColor(c.r, c.g, c.b, c.a), thickness);
}